

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O1

int __thiscall
ON_ModelComponent::CompareName(ON_ModelComponent *this,ON_UUID *other_parent_id,wchar_t *other_name)

{
  Type TVar1;
  int iVar2;
  int iVar3;
  wchar_t *name1;
  ON_wString *src;
  ON_wString OStack_28;
  
  TVar1 = this->m_component_type;
  if (TVar1 < 0x12) {
    iVar3 = 0;
    if ((0x2ffdeU >> (TVar1 & 0x1f) & 1) != 0) goto LAB_0053b592;
    if (TVar1 == Layer) {
      if ((this->m_set_status & 0x20) != 0) {
        iVar3 = ON_UuidCompare(&this->m_component_parent_id,other_parent_id);
      }
      goto LAB_0053b592;
    }
  }
  iVar3 = 0;
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
             ,0x7e5,"","Invalid component_type parameter.");
LAB_0053b592:
  iVar2 = iVar3;
  if (iVar3 == 0) {
    if ((this->m_set_status & 0x20) == 0) {
      src = &ON_wString::EmptyString;
    }
    else {
      src = &this->m_component_name;
    }
    ON_wString::ON_wString(&OStack_28,src);
    name1 = ON_wString::operator_cast_to_wchar_t_(&OStack_28);
    iVar2 = ON_wString::CompareAttributeName(name1,other_name);
  }
  if (iVar3 == 0) {
    ON_wString::~ON_wString(&OStack_28);
  }
  return iVar2;
}

Assistant:

int ON_ModelComponent::CompareName(
  const ON_UUID& other_parent_id,
  const wchar_t* other_name
  ) const
{
  int rc
    = (ON_ModelComponent::UniqueNameIncludesParent(m_component_type) && NameIsSet())
    ? ON_UuidCompare(m_component_parent_id, other_parent_id)
    : 0;
  return
    (0 != rc)
    ? rc
    : ON_wString::CompareAttributeName(Name(), other_name);
}